

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__zhuffman_decode(stbi__zbuf *a,stbi__zhuffman *z)

{
  int iVar1;
  uint uVar2;
  int s;
  int b;
  stbi__zhuffman *z_local;
  stbi__zbuf *a_local;
  
  if (a->num_bits < 0x10) {
    iVar1 = stbi__zeof(a);
    if (iVar1 == 0) {
      stbi__fill_bits(a);
    }
    else {
      if (a->hit_zeof_once != 0) {
        return -1;
      }
      a->hit_zeof_once = 1;
      a->num_bits = a->num_bits + 0x10;
    }
  }
  uVar2 = (uint)z->fast[a->code_buffer & 0x1ff];
  if (uVar2 == 0) {
    a_local._4_4_ = stbi__zhuffman_decode_slowpath(a,z);
  }
  else {
    a->code_buffer = a->code_buffer >> ((byte)((int)uVar2 >> 9) & 0x1f);
    a->num_bits = a->num_bits - ((int)uVar2 >> 9);
    a_local._4_4_ = uVar2 & 0x1ff;
  }
  return a_local._4_4_;
}

Assistant:

stbi_inline static int stbi__zhuffman_decode(stbi__zbuf *a, stbi__zhuffman *z)
{
   int b,s;
   if (a->num_bits < 16) {
      if (stbi__zeof(a)) {
         if (!a->hit_zeof_once) {
            // This is the first time we hit eof, insert 16 extra padding btis
            // to allow us to keep going; if we actually consume any of them
            // though, that is invalid data. This is caught later.
            a->hit_zeof_once = 1;
            a->num_bits += 16; // add 16 implicit zero bits
         } else {
            // We already inserted our extra 16 padding bits and are again
            // out, this stream is actually prematurely terminated.
            return -1;
         }
      } else {
         stbi__fill_bits(a);
      }
   }
   b = z->fast[a->code_buffer & STBI__ZFAST_MASK];
   if (b) {
      s = b >> 9;
      a->code_buffer >>= s;
      a->num_bits -= s;
      return b & 511;
   }
   return stbi__zhuffman_decode_slowpath(a, z);
}